

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall
InterpTest_Disassemble_Test::InterpTest_Disassemble_Test(InterpTest_Disassemble_Test *this)

{
  Features local_28;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_00241d48;
  local_28.exceptions_enabled_ = false;
  local_28.mutable_globals_enabled_ = true;
  local_28.sat_float_to_int_enabled_ = true;
  local_28.sign_extension_enabled_ = true;
  local_28.simd_enabled_ = true;
  local_28.threads_enabled_ = false;
  local_28.function_references_enabled_ = false;
  local_28.multi_value_enabled_ = true;
  local_28.tail_call_enabled_ = false;
  local_28.bulk_memory_enabled_ = true;
  local_28.reference_types_enabled_ = true;
  local_28.annotations_enabled_ = false;
  local_28.code_metadata_enabled_ = false;
  local_28.gc_enabled_ = false;
  local_28.memory64_enabled_ = false;
  local_28.multi_memory_enabled_ = false;
  local_28.extended_const_enabled_ = false;
  local_28.relaxed_simd_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpTest).store_,&local_28);
  memset(&(this->super_InterpTest).module_desc_,0,0x150);
  (this->super_InterpTest).super_Test._vptr_Test = (_func_int **)&PTR__InterpTest_002416d8;
  return;
}

Assistant:

TEST_F(InterpTest, Disassemble) {
  ReadModule(s_fac_module);

  MemoryStream stream;
  module_desc_.istream.Disassemble(&stream);
  auto buf = stream.ReleaseOutputBuffer();

  ExpectBufferStrEq(*buf,
R"(   0| alloca 1
   8| i32.const 1
  16| local.set $2, %[-1]
  24| local.get $1
  32| local.get $3
  40| i32.eqz %[-1]
  44| br_unless @60, %[-1]
  52| br @116
  60| local.get $3
  68| i32.mul %[-2], %[-1]
  72| local.set $2, %[-1]
  80| local.get $2
  88| i32.const 1
  96| i32.sub %[-2], %[-1]
 100| local.set $3, %[-1]
 108| br @24
 116| drop_keep $2 $1
 128| return
)");
}